

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallAndroidMKGenerator.cxx
# Opt level: O3

void __thiscall
cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode
          (cmExportInstallAndroidMKGenerator *this,ostream *os,string *param_2)

{
  cmInstallExportGenerator *pcVar1;
  pointer pcVar2;
  cmExportSet *pcVar3;
  cmTargetExport *pcVar4;
  cmInstallTargetGenerator *pcVar5;
  cmTarget *this_00;
  pointer ppcVar6;
  TargetType TVar7;
  size_t sVar8;
  ostream *poVar9;
  pointer ppcVar10;
  long lVar11;
  pointer ppcVar12;
  string dest;
  string path;
  string installDir;
  string local_d8;
  string local_b8;
  char *local_98;
  undefined8 local_90;
  char local_88;
  undefined7 uStack_87;
  char *local_78;
  long local_70;
  char local_68;
  undefined7 uStack_67;
  long *local_58;
  long local_50;
  long local_48 [2];
  pointer local_38;
  
  pcVar1 = (this->super_cmExportInstallFileGenerator).IEGen;
  local_58 = local_48;
  pcVar2 = (pcVar1->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_58,pcVar2,
             pcVar2 + (pcVar1->super_cmInstallGenerator).Destination._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(os,"LOCAL_PATH := $(call my-dir)\n",0x1d);
  sVar8 = cmsys::SystemTools::CountChar((char *)local_58,'/');
  local_78 = &local_68;
  local_70 = 0;
  local_68 = '\0';
  lVar11 = sVar8 + (local_50 != 0);
  if (lVar11 != 0) {
    do {
      std::__cxx11::string::append((char *)&local_78);
      lVar11 = lVar11 + -1;
    } while (lVar11 != 0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"_IMPORT_PREFIX := ",0x12);
  std::__ostream_insert<char,std::char_traits<char>>(os,"$(LOCAL_PATH)",0xd);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>(os,local_78,local_70);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\n\n",2);
  pcVar3 = ((this->super_cmExportInstallFileGenerator).IEGen)->ExportSet;
  ppcVar10 = (pcVar3->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppcVar12 = (pcVar3->TargetExports).
             super__Vector_base<cmTargetExport_*,_std::allocator<cmTargetExport_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  ppcVar6 = ppcVar12;
  if (ppcVar10 != ppcVar12) {
    do {
      local_38 = ppcVar6;
      pcVar4 = *ppcVar10;
      TVar7 = cmGeneratorTarget::GetType(pcVar4->Target);
      if (TVar7 != INTERFACE_LIBRARY) {
        local_98 = &local_88;
        local_90 = 0;
        local_88 = '\0';
        pcVar5 = pcVar4->LibraryGenerator;
        if (pcVar5 != (cmInstallTargetGenerator *)0x0) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
          cmInstallTargetGenerator::GetDestination(&local_b8,pcVar5,&local_d8);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        pcVar5 = pcVar4->ArchiveGenerator;
        if (pcVar5 != (cmInstallTargetGenerator *)0x0) {
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"");
          cmInstallTargetGenerator::GetDestination(&local_b8,pcVar5,&local_d8);
          std::__cxx11::string::operator=((string *)&local_98,(string *)&local_b8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
            operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
          }
        }
        this_00 = pcVar4->Target->Target;
        local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"__dest","");
        cmTarget::SetProperty(this_00,&local_b8,local_98);
        ppcVar12 = local_38;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (local_98 != &local_88) {
          operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
        }
      }
      ppcVar10 = ppcVar10 + 1;
      ppcVar6 = local_38;
    } while (ppcVar10 != ppcVar12);
  }
  if (local_78 != &local_68) {
    operator_delete(local_78,CONCAT71(uStack_67,local_68) + 1);
  }
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  return;
}

Assistant:

void cmExportInstallAndroidMKGenerator::GenerateImportHeaderCode(
  std::ostream& os, const std::string&)
{
  std::string installDir = this->IEGen->GetDestination();
  os << "LOCAL_PATH := $(call my-dir)\n";
  size_t numDotDot = cmSystemTools::CountChar(installDir.c_str(), '/');
  numDotDot += installDir.empty() ? 0 : 1;
  std::string path;
  for (size_t n = 0; n < numDotDot; n++) {
    path += "/..";
  }
  os << "_IMPORT_PREFIX := "
     << "$(LOCAL_PATH)" << path << "\n\n";
  for (cmTargetExport* te : *this->IEGen->GetExportSet()->GetTargetExports()) {
    // Collect import properties for this target.
    if (te->Target->GetType() == cmStateEnums::INTERFACE_LIBRARY) {
      continue;
    }
    std::string dest;
    if (te->LibraryGenerator) {
      dest = te->LibraryGenerator->GetDestination("");
    }
    if (te->ArchiveGenerator) {
      dest = te->ArchiveGenerator->GetDestination("");
    }
    te->Target->Target->SetProperty("__dest", dest.c_str());
  }
}